

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

void __thiscall
cmComputeLinkInformation::AddFrameworkItem(cmComputeLinkInformation *this,string *item)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  bool local_281;
  string local_280;
  cmStateSnapshot local_260;
  undefined1 local_248 [8];
  cmOutputConverter converter;
  undefined1 local_220 [8];
  string full_fw;
  string fw;
  string fw_path;
  ostringstream local_190 [8];
  ostringstream e;
  string *item_local;
  cmComputeLinkInformation *this_local;
  
  bVar1 = cmsys::RegularExpression::find(&this->SplitFramework,item);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&fw.field_2 + 8),&this->SplitFramework,1);
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)((long)&full_fw.field_2 + 8),&this->SplitFramework,2);
    std::__cxx11::string::string((string *)local_220,(string *)(fw.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_220,"/");
    std::__cxx11::string::operator+=
              ((string *)local_220,(string *)(full_fw.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_220,".framework");
    std::__cxx11::string::operator+=((string *)local_220,"/");
    std::__cxx11::string::operator+=
              ((string *)local_220,(string *)(full_fw.field_2._M_local_buf + 8));
    AddFrameworkPath(this,(string *)((long)&fw.field_2 + 8));
    AddLibraryRuntimeInfo(this,(string *)local_220);
    converter._31_1_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<char_const(&)[11],bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(char (*) [11])"-framework",(bool *)&converter.field_0x1f);
    cmMakefile::GetStateSnapshot(&local_260,this->Makefile);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_248,&local_260);
    cmOutputConverter::EscapeForShell
              (&local_280,(cmOutputConverter *)local_248,(string *)((long)&full_fw.field_2 + 8),
               false,false,false);
    std::__cxx11::string::operator=
              ((string *)(full_fw.field_2._M_local_buf + 8),(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    local_281 = false;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,bool>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (full_fw.field_2._M_local_buf + 8),&local_281);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)(full_fw.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fw.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"Could not parse framework path \"");
    poVar2 = std::operator<<(poVar2,(string *)item);
    poVar2 = std::operator<<(poVar2,"\" ");
    poVar2 = std::operator<<(poVar2,"linked by target ");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,".");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error((string *)((long)&fw_path.field_2 + 8));
    std::__cxx11::string::~string((string *)(fw_path.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddFrameworkItem(std::string const& item)
{
  // Try to separate the framework name and path.
  if (!this->SplitFramework.find(item)) {
    std::ostringstream e;
    e << "Could not parse framework path \"" << item << "\" "
      << "linked by target " << this->Target->GetName() << ".";
    cmSystemTools::Error(e.str());
    return;
  }

  std::string fw_path = this->SplitFramework.match(1);
  std::string fw = this->SplitFramework.match(2);
  std::string full_fw = fw_path;
  full_fw += "/";
  full_fw += fw;
  full_fw += ".framework";
  full_fw += "/";
  full_fw += fw;

  // Add the directory portion to the framework search path.
  this->AddFrameworkPath(fw_path);

  // add runtime information
  this->AddLibraryRuntimeInfo(full_fw);

  // Add the item using the -framework option.
  this->Items.emplace_back("-framework", false);
  cmOutputConverter converter(this->Makefile->GetStateSnapshot());
  fw = converter.EscapeForShell(fw);
  this->Items.emplace_back(fw, false);
}